

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O1

uint ctl_arena_init(tsd_t *tsd,arena_config_t *config)

{
  uint ind;
  ctl_arena_t *pcVar1;
  ctl_arenas_t *pcVar2;
  ctl_arena_t *pcVar3;
  ctl_arena_t *pcVar4;
  arena_t *paVar5;
  uint uVar6;
  
  pcVar2 = ctl_arenas;
  pcVar4 = (ctl_arenas->destroyed).qlh_first;
  if (pcVar4 == (ctl_arena_t *)0x0) {
    pcVar3 = (ctl_arena_t *)0x0;
  }
  else {
    pcVar3 = (pcVar4->destroyed_link).qre_prev;
  }
  if (pcVar3 == (ctl_arena_t *)0x0) {
    pcVar3 = (ctl_arena_t *)&ctl_arenas->narenas;
  }
  else {
    if (pcVar4 == pcVar3) {
      (ctl_arenas->destroyed).qlh_first = (pcVar4->destroyed_link).qre_next;
    }
    if ((pcVar2->destroyed).qlh_first == pcVar3) {
      (pcVar2->destroyed).qlh_first = (ctl_arena_t *)0x0;
    }
    else {
      pcVar4 = (pcVar3->destroyed_link).qre_prev;
      (pcVar4->destroyed_link).qre_next =
           (((pcVar3->destroyed_link).qre_next)->destroyed_link).qre_prev;
      pcVar1 = (pcVar3->destroyed_link).qre_next;
      (pcVar1->destroyed_link).qre_prev = pcVar4;
      pcVar4 = (((pcVar3->destroyed_link).qre_prev)->destroyed_link).qre_next;
      (pcVar3->destroyed_link).qre_prev = pcVar4;
      (((pcVar1->destroyed_link).qre_prev)->destroyed_link).qre_next = pcVar1;
      (pcVar4->destroyed_link).qre_next = pcVar3;
    }
  }
  ind = pcVar3->arena_ind;
  pcVar4 = arenas_i_impl(tsd,(ulong)ind,false,true);
  uVar6 = 0xffffffff;
  if (((pcVar4 != (ctl_arena_t *)0x0) &&
      (paVar5 = duckdb_je_arena_init((tsdn_t *)tsd,ind,config), paVar5 != (arena_t *)0x0)) &&
     (uVar6 = ind, ind == ctl_arenas->narenas)) {
    ctl_arenas->narenas = ctl_arenas->narenas + 1;
  }
  return uVar6;
}

Assistant:

static unsigned
ctl_arena_init(tsd_t *tsd, const arena_config_t *config) {
	unsigned arena_ind;
	ctl_arena_t *ctl_arena;

	if ((ctl_arena = ql_last(&ctl_arenas->destroyed, destroyed_link)) !=
	    NULL) {
		ql_remove(&ctl_arenas->destroyed, ctl_arena, destroyed_link);
		arena_ind = ctl_arena->arena_ind;
	} else {
		arena_ind = ctl_arenas->narenas;
	}

	/* Trigger stats allocation. */
	if (arenas_i_impl(tsd, arena_ind, false, true) == NULL) {
		return UINT_MAX;
	}

	/* Initialize new arena. */
	if (arena_init(tsd_tsdn(tsd), arena_ind, config) == NULL) {
		return UINT_MAX;
	}

	if (arena_ind == ctl_arenas->narenas) {
		ctl_arenas->narenas++;
	}

	return arena_ind;
}